

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.h
# Opt level: O2

void __thiscall mocker::detail::RegisterAllocator::~RegisterAllocator(RegisterAllocator *this)

{
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->spilledLastTime)._M_h);
  MoveInfo::~MoveInfo(&this->moveInfo);
  InterferenceGraph::~InterferenceGraph(&this->interG);
  return;
}

Assistant:

RegisterAllocator(nasm::Section &section, LineIter funcBeg, LineIter funcEnd)
      : section(section), funcBeg(funcBeg), funcEnd(funcEnd) {}